

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::TessCoordComponentInvarianceCase::iterate
          (TessCoordComponentInvarianceCase *this)

{
  TessPrimitiveType TVar1;
  TestLog *pTVar2;
  RenderContext *pRVar3;
  pointer pVVar4;
  int iVar5;
  deUint32 dVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  deUint32 tfPrimTypeGL;
  float *outer;
  Vector<float,_3> *value;
  int i;
  de *this_00;
  long lVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  deUint32 *pdVar12;
  long lVar13;
  bool bVar14;
  float fVar15;
  RandomViewport viewport;
  vector<float,_std::allocator<float>_> tessLevels;
  undefined8 local_2a0;
  Result tfResult;
  TFHandler tfHandler;
  VertexArrayBinding bindings [1];
  string local_1d0;
  Random rnd;
  
  pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  pRVar3 = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar5 = (*pRVar3->_vptr_RenderContext[4])(pRVar3);
  dVar6 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            (&viewport,(RenderTarget *)CONCAT44(extraout_var,iVar5),0x10,0x10,dVar6);
  iVar5 = (*pRVar3->_vptr_RenderContext[3])(pRVar3);
  lVar10 = CONCAT44(extraout_var_00,iVar5);
  deRandom_init(&rnd.m_rnd,0x7b);
  tessLevels.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  tessLevels.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  tessLevels.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  for (iVar5 = 0; iVar5 != 0x20; iVar5 = iVar5 + 1) {
    iVar9 = 6;
    while (bVar14 = iVar9 != 0, iVar9 = iVar9 + -1, bVar14) {
      fVar15 = deRandom_getFloat(&rnd.m_rnd);
      tfHandler.m_renderCtx._0_4_ = fVar15 * 62.0 + 1.0;
      std::vector<float,_std::allocator<float>_>::emplace_back<float>
                (&tessLevels,(float *)&tfHandler);
    }
  }
  dVar6 = (((this->m_program).m_ptr)->m_program).m_program;
  (**(code **)(lVar10 + 0x1680))();
  outer = (float *)(ulong)(uint)viewport.height;
  (**(code **)(lVar10 + 0x1a00))(viewport.x,viewport.y,viewport.width);
  (**(code **)(lVar10 + 0xfd8))(0x8e72,6);
  iVar5 = 0;
  for (lVar10 = 0; lVar10 != 0x300; lVar10 = lVar10 + 0x18) {
    outer = (float *)((long)tessLevels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start + lVar10);
    iVar9 = referenceVertexCount
                      (this->m_primitiveType,this->m_spacing,this->m_usePointMode,outer,
                       (float *)((long)tessLevels.super__Vector_base<float,_std::allocator<float>_>.
                                       _M_impl.super__Vector_impl_data._M_start + lVar10 + 8));
    if (iVar5 <= iVar9) {
      iVar5 = iVar9;
    }
  }
  TransformFeedbackHandler<tcu::Vector<float,_3>_>::TransformFeedbackHandler
            (&tfHandler,((this->super_TestCase).m_context)->m_renderCtx,iVar5);
  lVar10 = 0;
  do {
    pdVar12 = &rnd.m_rnd.z;
    if (lVar10 == 0x20) {
      TransformFeedbackHandler<tcu::Vector<float,_3>_>::~TransformFeedbackHandler(&tfHandler);
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
      goto LAB_0121e9de;
    }
    rnd.m_rnd._0_8_ = pTVar2;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)pdVar12);
    std::operator<<((ostream *)pdVar12,"Testing with tessellation levels: ");
    Functional::(anonymous_namespace)::tessellationLevelsString_abi_cxx11_
              ((string *)bindings,
               (_anonymous_namespace_ *)
               (tessLevels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start + lVar10 * 6),
               tessLevels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start + lVar10 * 6 + 2,outer);
    std::operator<<((ostream *)pdVar12,(string *)bindings);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&rnd,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::~string((string *)bindings);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)pdVar12);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&rnd,"in_v_attr",(allocator<char> *)&tfResult);
    glu::va::Float(bindings,(string *)&rnd,1,6,0,
                   tessLevels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start + lVar10 * 6);
    std::__cxx11::string::~string((string *)&rnd);
    tfPrimTypeGL = 0;
    if (this->m_usePointMode == false) {
      tfPrimTypeGL = 0xffffffff;
      if ((ulong)this->m_primitiveType < 3) {
        tfPrimTypeGL = *(deUint32 *)(&DAT_01890e10 + (ulong)this->m_primitiveType * 4);
      }
    }
    TransformFeedbackHandler<tcu::Vector<float,_3>_>::renderAndGetPrimitives
              (&tfResult,&tfHandler,dVar6,tfPrimTypeGL,1,bindings,6);
    lVar13 = 0;
    lVar11 = 0;
    while( true ) {
      pVVar4 = tfResult.varying.
               super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      outer = (float *)0xc;
      lVar7 = (long)(int)(((long)tfResult.varying.
                                 super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)tfResult.varying.
                                super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                ._M_impl.super__Vector_impl_data._M_start) / 0xc);
      if (lVar7 <= lVar11) break;
      this_00 = (de *)(tfResult.varying.
                       super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar11);
      TVar1 = this->m_primitiveType;
      lVar8 = 0;
      while ((ulong)(TVar1 == TESSPRIMITIVETYPE_TRIANGLES) + 2 != lVar8) {
        iVar5 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])
                          (*(undefined4 *)((long)pVVar4->m_data + lVar8 * 4 + lVar13),this);
        lVar8 = lVar8 + 1;
        if ((char)iVar5 == '\0') {
          pdVar12 = &rnd.m_rnd.z;
          rnd.m_rnd._0_8_ = pTVar2;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)pdVar12);
          std::operator<<((ostream *)pdVar12,"Note: output value at index ");
          std::ostream::operator<<(pdVar12,(int)lVar11);
          std::operator<<((ostream *)pdVar12," is ");
          if (this->m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES) {
            de::toString<tcu::Vector<float,3>>(&local_1d0,this_00,value);
          }
          else {
            local_2a0 = *(undefined8 *)this_00;
            de::toString<tcu::Vector<float,2>>
                      (&local_1d0,(de *)&local_2a0,(Vector<float,_2> *)value);
          }
          std::operator<<((ostream *)pdVar12,(string *)&local_1d0);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)&rnd,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::string::~string((string *)&local_1d0);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)pdVar12);
          tcu::TestContext::setTestResult
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                     QP_TEST_RESULT_FAIL,"Invalid tessellation coordinate component");
          goto LAB_0121e970;
        }
      }
      lVar11 = lVar11 + 1;
      lVar13 = lVar13 + 0xc;
    }
LAB_0121e970:
    std::_Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::~_Vector_base
              (&tfResult.varying.
                super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>);
    std::__cxx11::string::~string((string *)&bindings[0].binding.name);
    lVar10 = lVar10 + 1;
  } while (lVar7 <= lVar11);
  TransformFeedbackHandler<tcu::Vector<float,_3>_>::~TransformFeedbackHandler(&tfHandler);
LAB_0121e9de:
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&tessLevels.super__Vector_base<float,_std::allocator<float>_>);
  return STOP;
}

Assistant:

TessCoordComponentInvarianceCase::IterateResult TessCoordComponentInvarianceCase::iterate (void)
{
	typedef TransformFeedbackHandler<Vec3> TFHandler;

	TestLog&				log					= m_testCtx.getLog();
	const RenderContext&	renderCtx			= m_context.getRenderContext();
	const RandomViewport	viewport			(renderCtx.getRenderTarget(), RENDER_SIZE, RENDER_SIZE, deStringHash(getName()));
	const glw::Functions&	gl					= renderCtx.getFunctions();
	const int				numTessLevelCases	= 32;
	const vector<float>		tessLevels			= genTessLevelCases(numTessLevelCases);
	const deUint32			programGL			= m_program->getProgram();

	gl.useProgram(programGL);
	setViewport(gl, viewport);
	gl.patchParameteri(GL_PATCH_VERTICES, 6);

	{
		// Compute the number vertices in the largest draw call, so we can allocate the TF buffer just once.
		int maxNumVerticesInDrawCall = 0;
		for (int i = 0; i < numTessLevelCases; i++)
			maxNumVerticesInDrawCall = de::max(maxNumVerticesInDrawCall, referenceVertexCount(m_primitiveType, m_spacing, m_usePointMode, &tessLevels[6*i+0], &tessLevels[6*i+2]));

		{
			const TFHandler tfHandler(m_context.getRenderContext(), maxNumVerticesInDrawCall);

			for (int tessLevelCaseNdx = 0; tessLevelCaseNdx < numTessLevelCases; tessLevelCaseNdx++)
			{
				log << TestLog::Message << "Testing with tessellation levels: " << tessellationLevelsString(&tessLevels[6*tessLevelCaseNdx+0], &tessLevels[6*tessLevelCaseNdx+2]) << TestLog::EndMessage;

				const glu::VertexArrayBinding bindings[] = { glu::va::Float("in_v_attr", 1, (int)6, 0, &tessLevels[6*tessLevelCaseNdx]) };
				const TFHandler::Result tfResult = tfHandler.renderAndGetPrimitives(programGL, outputPrimitiveTypeGL(m_primitiveType, m_usePointMode),
																					DE_LENGTH_OF_ARRAY(bindings), &bindings[0], 6);

				for (int vtxNdx = 0; vtxNdx < (int)tfResult.varying.size(); vtxNdx++)
				{
					const Vec3&		vec			= tfResult.varying[vtxNdx];
					const int		numComps	= m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES ? 3 : 2;

					for (int compNdx = 0; compNdx < numComps; compNdx++)
					{
						if (!checkTessCoordComponent(vec[compNdx]))
						{
							log << TestLog::Message << "Note: output value at index " << vtxNdx << " is "
													<< (m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES ? de::toString(vec) : de::toString(vec.swizzle(0,1)))
													<< TestLog::EndMessage;
							m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid tessellation coordinate component");
							return STOP;
						}
					}
				}
			}
		}
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}